

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O1

void __thiscall tcpp::StringInputStream::~StringInputStream(StringInputStream *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IInputStream)._vptr_IInputStream = (_func_int **)&PTR__StringInputStream_001c1b18;
  pcVar1 = (this->mSourceStr)._M_dataplus._M_p;
  paVar2 = &(this->mSourceStr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~StringInputStream() TCPP_NOEXCEPT = default;